

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_array_find(JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int findIndex)

{
  JSValue v_00;
  JSValue v_01;
  JSValue v_02;
  JSValue v_03;
  JSValue v_04;
  JSValue v_05;
  JSValue v_06;
  JSValue v_07;
  JSValue v_08;
  JSValue v_09;
  JSValue val_00;
  JSValue this_obj;
  JSValue this_obj_00;
  JSValue v_10;
  JSValue JVar1;
  int iVar2;
  JSContext *in_RDI;
  int in_R9D;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  int64_t k;
  int64_t len;
  JSValue res;
  JSValue index_val;
  JSValue val;
  JSValue obj;
  JSValue args [3];
  JSValue this_arg;
  JSValue func;
  JSValue v;
  JSContext *in_stack_fffffffffffffe20;
  JSValueUnion in_stack_fffffffffffffe28;
  JSValueUnion in_stack_fffffffffffffe30;
  int64_t *in_stack_fffffffffffffe38;
  JSContext *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  int32_t iVar6;
  undefined4 in_stack_fffffffffffffe4c;
  int argc_00;
  int64_t in_stack_fffffffffffffe50;
  undefined4 uVar7;
  undefined4 in_stack_fffffffffffffe5c;
  JSContext *ctx_00;
  undefined4 uVar8;
  undefined4 in_stack_fffffffffffffe7c;
  int64_t iVar9;
  uint uStack_174;
  JSValue *argv_00;
  long local_168;
  long local_160;
  JSContext *in_stack_fffffffffffffeb0;
  JSContext *pJVar10;
  int32_t local_90;
  undefined4 uStack_8c;
  JSContext *local_88;
  undefined4 uStack_6c;
  JSValueUnion local_60;
  JSContext *local_58;
  JSValueUnion local_30;
  JSContext *local_28;
  undefined4 uStack_c;
  
  argv_00 = (JSValue *)0x3;
  uVar8 = 0;
  iVar9 = 3;
  JVar3.tag = 3;
  JVar3.u.ptr = (void *)((ulong)uStack_174 << 0x20);
  JVar3 = JS_ToObject(in_stack_fffffffffffffeb0,JVar3);
  JVar4.u._4_4_ = in_stack_fffffffffffffe4c;
  JVar4.u.int32 = in_stack_fffffffffffffe48;
  JVar4.tag = in_stack_fffffffffffffe50;
  iVar2 = js_get_length64(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,JVar4);
  if ((iVar2 == 0) &&
     (JVar5.tag = (int64_t)in_stack_fffffffffffffe38, JVar5.u.ptr = in_stack_fffffffffffffe30.ptr,
     iVar2 = check_function((JSContext *)in_stack_fffffffffffffe28.ptr,JVar5), iVar2 == 0)) {
    uVar7 = 0;
    ctx_00 = (JSContext *)0x3;
    for (local_168 = 0; local_168 < local_160; local_168 = local_168 + 1) {
      if (local_168 == (int)local_168) {
        local_30._4_4_ = uStack_c;
        local_30.int32 = (int)local_168;
        local_28 = (JSContext *)0x0;
      }
      else {
        JVar4 = __JS_NewFloat64(in_RDI,(double)local_168);
        local_60 = JVar4.u;
        local_30 = local_60;
        local_58 = (JSContext *)JVar4.tag;
        local_28 = local_58;
      }
      iVar6 = local_30.int32;
      argc_00 = local_30._4_4_;
      v_10.tag = (int64_t)local_28;
      v_10.u.float64 = local_30.float64;
      pJVar10 = local_28;
      iVar2 = JS_IsException(v_10);
      if (iVar2 != 0) goto LAB_001b0102;
      this_obj_00.u._4_4_ = in_stack_fffffffffffffe7c;
      this_obj_00.u.int32 = uVar8;
      this_obj_00.tag = iVar9;
      JVar4 = JS_GetPropertyValue(ctx_00,this_obj_00,JVar3);
      local_88 = (JSContext *)JVar4.tag;
      iVar2 = JS_IsException(JVar4);
      if (iVar2 != 0) goto LAB_001b0102;
      this_obj.u._4_4_ = in_stack_fffffffffffffe5c;
      this_obj.u.int32 = uVar7;
      this_obj.tag = (int64_t)ctx_00;
      JVar5 = JS_Call(local_28,JVar3,this_obj,argc_00,argv_00);
      in_stack_fffffffffffffe28 = JVar5.u;
      in_stack_fffffffffffffe30 = (JSValueUnion)JVar5.tag;
      iVar2 = JS_IsException(JVar5);
      if (iVar2 != 0) goto LAB_001b0102;
      val_00.tag._0_4_ = uVar7;
      val_00.u.ptr = local_28;
      val_00.tag._4_4_ = in_stack_fffffffffffffe5c;
      iVar2 = JS_ToBoolFree((JSContext *)CONCAT44(argc_00,iVar6),val_00);
      if (iVar2 != 0) {
        if (in_R9D == 0) {
          v_02.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
          v_02.u.ptr = in_stack_fffffffffffffe28.ptr;
          JS_FreeValue(in_stack_fffffffffffffe20,v_02);
          v_03.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
          v_03.u.ptr = in_stack_fffffffffffffe28.ptr;
          JS_FreeValue(in_stack_fffffffffffffe20,v_03);
          local_90 = JVar4.u._0_4_;
          uStack_8c = JVar4.u._4_4_;
        }
        else {
          v_00.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
          v_00.u.ptr = in_stack_fffffffffffffe28.ptr;
          JS_FreeValue(in_stack_fffffffffffffe20,v_00);
          v_01.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
          v_01.u.ptr = in_stack_fffffffffffffe28.ptr;
          JS_FreeValue(in_stack_fffffffffffffe20,v_01);
          local_90 = local_30.int32;
          uStack_8c = local_30._4_4_;
          local_88 = pJVar10;
        }
        goto LAB_001b0170;
      }
      v_04.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
      v_04.u.ptr = in_stack_fffffffffffffe28.ptr;
      JS_FreeValue(in_stack_fffffffffffffe20,v_04);
      v_05.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
      v_05.u.ptr = in_stack_fffffffffffffe28.ptr;
      JS_FreeValue(in_stack_fffffffffffffe20,v_05);
    }
    v_06.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
    v_06.u.ptr = in_stack_fffffffffffffe28.ptr;
    JS_FreeValue(in_stack_fffffffffffffe20,v_06);
    if (in_R9D == 0) {
      local_90 = 0;
      local_88 = (JSContext *)0x3;
    }
    else {
      local_90 = -1;
      uStack_8c = uStack_6c;
      local_88 = (JSContext *)0x0;
    }
  }
  else {
LAB_001b0102:
    v_07.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
    v_07.u.ptr = in_stack_fffffffffffffe28.ptr;
    JS_FreeValue(in_stack_fffffffffffffe20,v_07);
    v_08.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
    v_08.u.ptr = in_stack_fffffffffffffe28.ptr;
    JS_FreeValue(in_stack_fffffffffffffe20,v_08);
    v_09.tag = (int64_t)in_stack_fffffffffffffe30.ptr;
    v_09.u.ptr = in_stack_fffffffffffffe28.ptr;
    JS_FreeValue(in_stack_fffffffffffffe20,v_09);
    local_90 = 0;
    local_88 = (JSContext *)0x6;
  }
LAB_001b0170:
  JVar1.u._4_4_ = uStack_8c;
  JVar1.u.int32 = local_90;
  JVar1.tag = (int64_t)local_88;
  return JVar1;
}

Assistant:

static JSValue js_array_find(JSContext *ctx, JSValueConst this_val,
                             int argc, JSValueConst *argv, int findIndex)
{
    JSValueConst func, this_arg;
    JSValueConst args[3];
    JSValue obj, val, index_val, res;
    int64_t len, k;

    index_val = JS_UNDEFINED;
    val = JS_UNDEFINED;
    obj = JS_ToObject(ctx, this_val);
    if (js_get_length64(ctx, &len, obj))
        goto exception;

    func = argv[0];
    if (check_function(ctx, func))
        goto exception;

    this_arg = JS_UNDEFINED;
    if (argc > 1)
        this_arg = argv[1];

    for(k = 0; k < len; k++) {
        index_val = JS_NewInt64(ctx, k);
        if (JS_IsException(index_val))
            goto exception;
        val = JS_GetPropertyValue(ctx, obj, index_val);
        if (JS_IsException(val))
            goto exception;
        args[0] = val;
        args[1] = index_val;
        args[2] = this_val;
        res = JS_Call(ctx, func, this_arg, 3, args);
        if (JS_IsException(res))
            goto exception;
        if (JS_ToBoolFree(ctx, res)) {
            if (findIndex) {
                JS_FreeValue(ctx, val);
                JS_FreeValue(ctx, obj);
                return index_val;
            } else {
                JS_FreeValue(ctx, index_val);
                JS_FreeValue(ctx, obj);
                return val;
            }
        }
        JS_FreeValue(ctx, val);
        JS_FreeValue(ctx, index_val);
    }
    JS_FreeValue(ctx, obj);
    if (findIndex)
        return JS_NewInt32(ctx, -1);
    else
        return JS_UNDEFINED;

exception:
    JS_FreeValue(ctx, index_val);
    JS_FreeValue(ctx, val);
    JS_FreeValue(ctx, obj);
    return JS_EXCEPTION;
}